

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O0

XMLTokens __thiscall xercesc_4_0::XMLScanner::senseNextToken(XMLScanner *this,XMLSize_t *orgReader)

{
  bool bVar1;
  XMLCh XVar2;
  XMLSize_t XVar3;
  ReaderMgr *this_00;
  undefined1 local_40 [8];
  ThrowEOEJanitor janMgr;
  XMLReader *curReader;
  XMLCh nextCh;
  XMLSize_t *orgReader_local;
  XMLScanner *this_local;
  
  janMgr.fMgr = (ReaderMgr *)ReaderMgr::getCurrentReader(&this->fReaderMgr);
  if (((XMLReader *)janMgr.fMgr == (XMLReader *)0x0) ||
     (XVar3 = XMLReader::charsLeftInBuffer((XMLReader *)janMgr.fMgr), XVar3 == 0)) {
    ThrowEOEJanitor::ThrowEOEJanitor((ThrowEOEJanitor *)local_40,&this->fReaderMgr,true);
    curReader._6_2_ = ReaderMgr::peekNextChar(&this->fReaderMgr);
    ThrowEOEJanitor::~ThrowEOEJanitor((ThrowEOEJanitor *)local_40);
  }
  else {
    curReader._6_2_ = ReaderMgr::peekNextChar(&this->fReaderMgr);
  }
  if (curReader._6_2_ == L'<') {
    this_00 = &this->fReaderMgr;
    ReaderMgr::getNextChar(this_00);
    XVar3 = ReaderMgr::getCurrentReaderNum(this_00);
    *orgReader = XVar3;
    XVar2 = ReaderMgr::peekNextChar(this_00);
    if (XVar2 == L'!') {
      bVar1 = ReaderMgr::skippedString(&this->fReaderMgr,L"![CDATA");
      if (bVar1) {
        this_local._4_4_ = Token_CData;
      }
      else {
        bVar1 = ReaderMgr::skippedString(&this->fReaderMgr,L"!--");
        if (bVar1) {
          this_local._4_4_ = Token_Comment;
        }
        else {
          emitError(this,ExpectedCommentOrCDATA);
          this_local._4_4_ = Token_Unknown;
        }
      }
    }
    else if (XVar2 == L'/') {
      ReaderMgr::getNextChar(&this->fReaderMgr);
      this_local._4_4_ = Token_EndTag;
    }
    else if (XVar2 == L'?') {
      ReaderMgr::getNextChar(&this->fReaderMgr);
      this_local._4_4_ = Token_PI;
    }
    else {
      this_local._4_4_ = Token_StartTag;
    }
  }
  else {
    this_local._4_4_ = Token_EOF;
    if (curReader._6_2_ != L'\0') {
      this_local._4_4_ = Token_CharData;
    }
  }
  return this_local._4_4_;
}

Assistant:

XMLScanner::XMLTokens XMLScanner::senseNextToken(XMLSize_t& orgReader)
{
    //  Get the next character and use it to guesstimate what the next token
    //  is going to be. We turn on end of entity exceptions when we do this
    //  in order to catch the scenario where the current entity ended at
    //  the > of some markup.
    XMLCh nextCh=0;

    XMLReader* curReader=fReaderMgr.getCurrentReader();
    // avoid setting up the ThrowEOEJanitor if we know that we have data in the current reader
    if(curReader && curReader->charsLeftInBuffer()>0)
        nextCh = fReaderMgr.peekNextChar();
    else
    {
        ThrowEOEJanitor janMgr(&fReaderMgr, true);
        nextCh = fReaderMgr.peekNextChar();
    }

    //  If it's not a '<' we must be in content (unless it's a EOF)
    //
    //  This includes entity references '&' of some sort. These must
    //  be character data because that's the only place a reference can
    //  occur in content.
    if (nextCh != chOpenAngle)
        return nextCh?Token_CharData:Token_EOF;

    //  Ok it had to have been a '<' character. So get it out of the reader
    //  and store the reader number where we saw it, passing it back to the
    //  caller.
    fReaderMgr.getNextChar();
    orgReader = fReaderMgr.getCurrentReaderNum();

    //  Ok, so lets go through the things that it could be at this point which
    //  are all some form of markup.
    switch(fReaderMgr.peekNextChar())
    {
    case chForwardSlash:
        {
            fReaderMgr.getNextChar();
            return Token_EndTag;
        }
    case chBang:
        {
            static const XMLCh gCDATAStr[] =
            {
                    chBang, chOpenSquare, chLatin_C, chLatin_D, chLatin_A
                ,   chLatin_T, chLatin_A, chNull
            };

            static const XMLCh gCommentString[] =
            {
                chBang, chDash, chDash, chNull
            };

            if (fReaderMgr.skippedString(gCDATAStr))
                return Token_CData;

            if (fReaderMgr.skippedString(gCommentString))
                return Token_Comment;

            emitError(XMLErrs::ExpectedCommentOrCDATA);
            return Token_Unknown;
        }
    case chQuestion:
        {
            // It must be a PI
            fReaderMgr.getNextChar();
            return Token_PI;
        }
    }
    //  Assume its an element name, so return with a start tag token. If it
    //  turns out not to be, then it will fail when it cannot get a valid tag.
    return Token_StartTag;
}